

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall ON_GeometryFingerprint::ON_GeometryFingerprint(ON_GeometryFingerprint *this)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  
  ON_WeightedAverageHash::ON_WeightedAverageHash(&this->m_pointWAH);
  ON_WeightedAverageHash::ON_WeightedAverageHash(&this->m_edgeWAH);
  this->m_topologyCRC = 0;
  lVar3 = 8;
  do {
    *(double *)((long)&(this->m_pointWAH).m_sum[0].y + lVar3) = ON_3dPoint::Origin.z;
    dVar2 = ON_3dPoint::Origin.y;
    pdVar1 = (double *)((long)(this->m_pointWAH).m_sum + lVar3 + -8);
    *pdVar1 = ON_3dPoint::Origin.x;
    pdVar1[1] = dVar2;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x80);
  lVar3 = 0;
  do {
    *(double *)((long)&(this->m_edgeWAH).m_sum[0].z + lVar3) = ON_3dPoint::Origin.z;
    dVar2 = ON_3dPoint::Origin.y;
    pdVar1 = (double *)((long)&(this->m_edgeWAH).m_sum[0].x + lVar3);
    *pdVar1 = ON_3dPoint::Origin.x;
    pdVar1[1] = dVar2;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x78);
  return;
}

Assistant:

ON_GeometryFingerprint::ON_GeometryFingerprint()
{
  Zero();
}